

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.cc
# Opt level: O0

bool __thiscall
mp::internal::TextReader<fmt::Locale>::ReadOptionalDouble
          (TextReader<fmt::Locale> *this,double *value)

{
  double *in_RSI;
  TextReader<fmt::Locale> *in_RDI;
  double dVar1;
  bool has_value;
  char *end;
  char *local_20;
  double *local_18;
  bool local_1;
  
  local_18 = in_RSI;
  SkipSpace(in_RDI);
  if (*(in_RDI->super_ReaderBase).ptr_ == '\n') {
    local_1 = false;
  }
  else {
    local_20 = (char *)0x0;
    dVar1 = strtod((in_RDI->super_ReaderBase).ptr_,&local_20);
    *local_18 = dVar1;
    local_1 = (in_RDI->super_ReaderBase).ptr_ != local_20;
    (in_RDI->super_ReaderBase).ptr_ = local_20;
  }
  return local_1;
}

Assistant:

bool mp::internal::TextReader<Locale>::ReadOptionalDouble(double &value) {
  SkipSpace();
  if (*ptr_ == '\n')
    return false;
  char *end = 0;
  value = std::strtod(ptr_, &end);
  bool has_value = ptr_ != end;
  ptr_ = end;
  return has_value;
}